

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::Literal::standardizeNaN(Literal *__return_storage_ptr__,Literal *input)

{
  bool bVar1;
  uint uVar2;
  float init;
  double dVar3;
  unsigned_long local_30;
  BasicType local_24;
  uint local_20;
  BasicType local_1c;
  Literal *local_18;
  Literal *input_local;
  
  local_18 = input;
  input_local = __return_storage_ptr__;
  dVar3 = getFloat(input);
  uVar2 = std::isnan(dVar3);
  if ((uVar2 & 1) == 0) {
    Literal(__return_storage_ptr__,local_18);
  }
  else {
    local_1c = f32;
    bVar1 = wasm::Type::operator==(&local_18->type,&local_1c);
    if (bVar1) {
      local_20 = 0x7fc00000;
      init = bit_cast<float,unsigned_int>(&local_20);
      Literal(__return_storage_ptr__,init);
    }
    else {
      local_24 = f64;
      bVar1 = wasm::Type::operator==(&local_18->type,&local_24);
      if (!bVar1) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                           ,0x13d);
      }
      local_30 = 0x7ff8000000000000;
      dVar3 = bit_cast<double,unsigned_long>(&local_30);
      Literal(__return_storage_ptr__,dVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::standardizeNaN(const Literal& input) {
  if (!std::isnan(input.getFloat())) {
    return input;
  }
  // Pick a simple canonical payload, and positive.
  if (input.type == Type::f32) {
    return Literal(bit_cast<float>(uint32_t(0x7fc00000u)));
  } else if (input.type == Type::f64) {
    return Literal(bit_cast<double>(uint64_t(0x7ff8000000000000ull)));
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
}